

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTLogicExpression.cpp
# Opt level: O3

void __thiscall MathML::AST::LogicExpression::~LogicExpression(LogicExpression *this)

{
  INode *pIVar1;
  pointer ppIVar2;
  pointer ppIVar3;
  ulong uVar4;
  
  (this->super_INode)._vptr_INode = (_func_int **)&PTR__LogicExpression_009b6968;
  ppIVar3 = (this->mOperands).
            super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar2 = (this->mOperands).
            super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar2 != ppIVar3) {
    uVar4 = 0;
    do {
      pIVar1 = ppIVar3[uVar4];
      if (pIVar1 != (INode *)0x0) {
        (*pIVar1->_vptr_INode[1])(pIVar1);
        ppIVar3 = (this->mOperands).
                  super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppIVar2 = (this->mOperands).
                  super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)ppIVar2 - (long)ppIVar3 >> 3));
  }
  if (ppIVar3 != (pointer)0x0) {
    operator_delete(ppIVar3,(long)(this->mOperands).
                                  super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar3
                   );
    return;
  }
  return;
}

Assistant:

LogicExpression::~LogicExpression()
        {
            for (size_t i=0; i<mOperands.size(); ++i)
            {
                delete mOperands.at( i );
            }
        }